

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

double nk_pow(double x,int n)

{
  undefined8 local_28;
  undefined4 local_20;
  int plus;
  double r;
  int n_local;
  double x_local;
  
  r = 1.0;
  local_20 = n;
  if (n < 0) {
    local_20 = -n;
  }
  x_local = x;
  for (n_local = local_20; 0 < n_local; n_local = n_local / 2) {
    if ((n_local & 1U) == 1) {
      r = x_local * r;
    }
    x_local = x_local * x_local;
  }
  if (n < 0) {
    local_28 = 1.0 / r;
  }
  else {
    local_28 = r;
  }
  return local_28;
}

Assistant:

NK_INTERN double
nk_pow(double x, int n)
{
    /*  check the sign of n */
    double r = 1;
    int plus = n >= 0;
    n = (plus) ? n : -n;
    while (n > 0) {
        if ((n & 1) == 1)
            r *= x;
        n /= 2;
        x *= x;
    }
    return plus ? r : 1.0 / r;
}